

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectList.cpp
# Opt level: O0

bool __thiscall ObjectList::CreateBoundingBox(ObjectList *this,float t_start,float t_end,AABB *aabb)

{
  long *plVar1;
  byte bVar2;
  float *in_RSI;
  AABB *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  int i;
  AABB _temp_aabb;
  AABB *in_stack_00000100;
  AABB *in_stack_00000108;
  AABB *this_00;
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 local_54;
  int local_4c;
  AABB local_38;
  float *local_20;
  undefined4 local_18;
  undefined4 local_14;
  byte local_1;
  
  if ((int)(in_RDI->m_max).e[1] < 1) {
    local_1 = 0;
  }
  else {
    this_00 = &local_38;
    local_20 = in_RSI;
    local_18 = in_XMM1_Da;
    local_14 = in_XMM0_Da;
    AABB::AABB(in_RDI);
    plVar1 = (long *)**(undefined8 **)((in_RDI->m_min).e + 2);
    bVar2 = (**(code **)(*plVar1 + 0x18))(local_14,local_18,plVar1,this_00);
    if ((bVar2 & 1) == 0) {
      local_1 = 0;
    }
    else {
      *(undefined8 *)local_20 = local_38.m_min.e._0_8_;
      local_20[2] = local_38.m_min.e[2];
      local_20[3] = local_38.m_max.e[0];
      *(undefined8 *)(local_20 + 4) = local_38.m_max.e._4_8_;
      for (local_4c = 1; local_4c < (int)(in_RDI->m_max).e[1]; local_4c = local_4c + 1) {
        plVar1 = *(long **)(*(long *)((in_RDI->m_min).e + 2) + (long)local_4c * 8);
        bVar2 = (**(code **)(*plVar1 + 0x18))(local_14,local_18,plVar1,&local_38);
        if ((bVar2 & 1) == 0) {
          local_1 = 0;
          goto LAB_001267f9;
        }
        AABB::Merge(in_stack_00000108,in_stack_00000100);
        *(undefined8 *)local_20 = local_64;
        *(undefined8 *)(local_20 + 2) = local_5c;
        *(undefined8 *)(local_20 + 4) = local_54;
        AABB::~AABB(this_00);
      }
      local_1 = 1;
    }
LAB_001267f9:
    AABB::~AABB(this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool 
ObjectList::CreateBoundingBox(float t_start, float t_end, AABB& aabb) const
{
    if(m_size < 1) {
        return false;
    }

    AABB _temp_aabb;
    if(m_list[0]->CreateBoundingBox(t_start, t_end, _temp_aabb)) {
        aabb = _temp_aabb;
    }
    else {
        return false;
    }

    for (int i = 1; i < m_size; i++) {
        if(!m_list[i]->CreateBoundingBox(t_start, t_end, _temp_aabb)) {
            return false;
        }
        aabb = AABB::Merge(aabb, _temp_aabb);
    }

    return true;
}